

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

mat4 * mat4_look_at(mat4 *__return_storage_ptr__,vec3 position,vec3 target,vec3 up)

{
  undefined1 auVar1 [16];
  mat4 m1;
  mat4 m2;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined1 auVar5 [16];
  float fVar6;
  float in_XMM3_Db;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar10;
  float in_XMM5_Db;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  mat4 mat_1;
  mat4 mat;
  
  fVar6 = up.z;
  auVar8._0_8_ = up._0_8_;
  auVar8._8_8_ = up._0_8_;
  auVar25._0_4_ = SQRT(fVar6 * fVar6 + up.x * up.x + up.y * up.y);
  fVar12 = 0.0;
  fVar14 = 0.0;
  fVar15 = 0.0;
  fVar16 = 0.0;
  fVar17 = 0.0;
  fVar18 = 0.0;
  fVar19 = 0.0;
  fVar21 = 0.0;
  if ((auVar25._0_4_ != 0.0) || (fVar20 = 0.0, NAN(auVar25._0_4_))) {
    fVar21 = fVar6 / auVar25._0_4_;
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    auVar8 = divps(auVar8,auVar25);
    fVar18 = auVar8._0_4_;
    fVar19 = auVar8._4_4_;
    fVar20 = in_XMM5_Db;
  }
  auVar5._0_4_ = target.x - position.x;
  auVar5._4_4_ = target.y - position.y;
  auVar5._8_4_ = target.x - in_XMM0_Dc;
  auVar5._12_4_ = target.y - in_XMM0_Dd;
  fVar6 = target.z - position.z;
  auVar9._0_4_ = SQRT(fVar6 * fVar6 + auVar5._0_4_ * auVar5._0_4_ + auVar5._4_4_ * auVar5._4_4_);
  if ((auVar9._0_4_ != 0.0) || (fVar13 = 0.0, NAN(auVar9._0_4_))) {
    fVar12 = fVar6 / auVar9._0_4_;
    auVar9._4_4_ = auVar9._0_4_;
    auVar9._8_4_ = auVar9._0_4_;
    auVar9._12_4_ = auVar9._0_4_;
    auVar8 = divps(auVar5,auVar9);
    fVar14 = auVar8._0_4_;
    fVar15 = auVar8._4_4_;
    fVar16 = auVar8._8_4_;
    fVar17 = auVar8._12_4_;
    fVar13 = in_XMM3_Db;
  }
  fVar6 = -fVar14;
  fVar7 = -fVar15;
  auVar27._0_4_ = fVar21 * fVar15 + -fVar19 * fVar12;
  auVar27._4_4_ = fVar12 * fVar18 + fVar6 * fVar21;
  auVar27._8_4_ = fVar13 * fVar16 + fVar6 * fVar13;
  auVar27._12_4_ = fVar20 * fVar17 + fVar6 * fVar20;
  fVar24 = fVar19 * fVar14 + fVar7 * fVar18;
  fVar29 = SQRT(fVar24 * fVar24 + auVar27._0_4_ * auVar27._0_4_ + auVar27._4_4_ * auVar27._4_4_);
  fVar16 = 0.0;
  uVar10 = 0;
  uVar11 = 0;
  fVar17 = 0.0;
  fVar18 = 0.0;
  fVar21 = 0.0;
  fVar20 = 0.0;
  fVar22 = 0.0;
  if ((fVar29 != 0.0) || (fVar23 = 0.0, NAN(fVar29))) {
    fVar22 = fVar24 / fVar29;
    auVar1._4_4_ = fVar29;
    auVar1._0_4_ = fVar29;
    auVar1._8_4_ = fVar29;
    auVar1._12_4_ = fVar29;
    auVar8 = divps(auVar27,auVar1);
    fVar17 = auVar8._0_4_;
    fVar18 = auVar8._4_4_;
    fVar21 = auVar8._8_4_;
    fVar20 = auVar8._12_4_;
    fVar23 = fVar19;
  }
  auVar26._0_4_ = fVar12 * fVar18 + fVar7 * fVar22;
  auVar26._4_4_ = fVar22 * fVar14 + -fVar17 * fVar12;
  auVar26._8_4_ = fVar23 * fVar21 + fVar7 * fVar23;
  auVar26._12_4_ = fVar13 * fVar20 + fVar7 * fVar13;
  fVar14 = fVar15 * fVar17 - fVar18 * fVar14;
  auVar28._0_4_ =
       SQRT(fVar14 * fVar14 + auVar26._0_4_ * auVar26._0_4_ + auVar26._4_4_ * auVar26._4_4_);
  if ((auVar28._0_4_ != 0.0) || (NAN(auVar28._0_4_))) {
    fVar16 = fVar14 / auVar28._0_4_;
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = auVar28._0_4_;
    auVar28._12_4_ = auVar28._0_4_;
    auVar8 = divps(auVar26,auVar28);
    uVar10 = auVar8._0_4_;
    uVar11 = auVar8._4_4_;
  }
  m1.m[1] = fVar18;
  m1.m[0] = fVar17;
  m1.m[5] = (float)uVar11;
  m1.m[4] = (float)uVar10;
  m1.m[9] = fVar7;
  m1.m[8] = fVar6;
  uVar2 = (ulong)(uint)position.x << 0x20 ^ 0x8000000000000000;
  uVar3 = (ulong)(uint)position.y << 0x20 ^ 0x8000000000000000;
  uVar4 = CONCAT44(position.z,0x3f800000) ^ 0x8000000000000000;
  m1.m[2] = fVar22;
  m1.m[3] = 0.0;
  m1.m[6] = fVar16;
  m1.m[7] = 0.0;
  m1.m[10] = (float)(int)((ulong)(uint)fVar12 ^ 0x80000000);
  m1.m[0xb] = (float)(int)(((ulong)(uint)fVar12 ^ 0x80000000) >> 0x20);
  m1.m[0xc] = 0.0;
  m1.m[0xd] = 0.0;
  m1.m[0xe] = 0.0;
  m1.m[0xf] = 1.0;
  m2.m[2] = (float)(int)uVar2;
  m2.m[3] = (float)(int)(uVar2 >> 0x20);
  m2.m[0] = 1.0;
  m2.m[1] = 0.0;
  m2.m[4] = 0.0;
  m2.m[5] = 1.0;
  m2.m[6] = (float)(int)uVar3;
  m2.m[7] = (float)(int)(uVar3 >> 0x20);
  m2.m[8] = 0.0;
  m2.m[9] = 0.0;
  m2.m[10] = (float)(int)uVar4;
  m2.m[0xb] = (float)(int)(uVar4 >> 0x20);
  m2.m[0xc] = 0.0;
  m2.m[0xd] = 0.0;
  m2.m[0xe] = 0.0;
  m2.m[0xf] = 1.0;
  mat4_multiply(m1,m2);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_look_at(vec3 position, vec3 target, vec3 up) {
    vec3 up_p = vec3_normalize(up);
    vec3 f = vec3_normalize(vec3_subtract(target, position));
    vec3 s = vec3_normalize(vec3_cross(f, up_p));
    vec3 u = vec3_normalize(vec3_cross(s, f));

    mat4 M = mat4_create(
            s.x, s.y, s.z, 0.0,
            u.x, u.y, u.z, 0.0,
            -f.x, -f.y, -f.z, 0.0,
            0.0, 0.0, 0.0, 1.0);
    mat4 T = mat4_translation(vec3_scale(position, -1.0));

    return mat4_multiply(M, T);
}